

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O1

int xstcMetadata(char *metadata,char *base)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  xmlNodePtr pxVar6;
  long lVar7;
  long lVar8;
  xmlNodePtr cur;
  int *piVar9;
  xmlChar *pxVar10;
  long lVar11;
  xmlChar *pxVar12;
  char *pcVar13;
  undefined8 uVar14;
  char *pcVar15;
  char *msg;
  stat buf;
  xmlChar *local_108;
  xmlChar *local_f8;
  stat64 local_c0;
  
  lVar5 = xmlReadFile(metadata,0,2);
  if (lVar5 == 0) {
    pcVar13 = "Failed to parse %s\n";
  }
  else {
    pxVar6 = (xmlNodePtr)xmlDocGetRootElement(lVar5);
    if ((pxVar6 != (xmlNodePtr)0x0) && (iVar1 = xmlStrEqual(pxVar6->name,"testSet"), iVar1 != 0)) {
      lVar7 = xmlGetProp(pxVar6,"contributor");
      if (lVar7 == 0) {
        lVar7 = xmlStrdup("Unknown");
      }
      lVar8 = xmlGetProp(pxVar6,"name");
      if (lVar8 == 0) {
        lVar8 = xmlStrdup("Unknown");
      }
      printf("## %s test suite for Schemas version %s\n",lVar7,lVar8);
      (*_xmlFree)(lVar7);
      (*_xmlFree)(lVar8);
      pxVar6 = getNext(pxVar6,"./ts:testGroup[1]");
      if ((pxVar6 == (xmlNodePtr)0x0) || (iVar1 = xmlStrEqual(pxVar6->name,"testGroup"), iVar1 == 0)
         ) {
        fprintf(_stderr,"Unexpected format %s\n",metadata);
      }
      else {
        do {
          xmlResetLastError();
          testErrorsSize = 0;
          testErrors[0] = '\0';
          iVar1 = xmlMemUsed();
          pxVar12 = getString(pxVar6,"string(ts:schemaTest/ts:schemaDocument/@xlink:href)");
          if ((pxVar12 == (xmlChar *)0x0) || (*pxVar12 == '\0')) {
            uVar14 = xmlGetLineNo(pxVar6);
            test_log("testGroup line %ld misses href for schemaDocument\n",uVar14);
LAB_0010366a:
            pcVar13 = (char *)0x0;
LAB_0010366d:
            local_f8 = (xmlChar *)0x0;
LAB_00103676:
            lVar7 = 0;
          }
          else {
            pcVar13 = (char *)xmlBuildURI(pxVar12,base);
            if (pcVar13 == (char *)0x0) {
              uVar14 = xmlGetLineNo(pxVar6);
              test_log("Failed to build path to schemas testGroup line %ld : %s\n",uVar14,pxVar12);
              goto LAB_0010366a;
            }
            iVar4 = stat64(pcVar13,&local_c0);
            if ((iVar4 == -1) || ((local_c0.st_mode & 0xf000) != 0x8000)) {
              uVar14 = xmlGetLineNo(pxVar6);
              test_log("schemas for testGroup line %ld is missing: %s\n",uVar14,pcVar13);
              goto LAB_0010366d;
            }
            local_f8 = getString(pxVar6,"string(ts:schemaTest/ts:expected/@validity)");
            if (local_f8 == (xmlChar *)0x0) {
              uVar14 = xmlGetLineNo(pxVar6);
              test_log("testGroup line %ld misses expected validity\n",uVar14);
              goto LAB_0010366d;
            }
            nb_tests = nb_tests + 1;
            iVar4 = xmlStrEqual(local_f8,"valid");
            if (iVar4 == 0) {
              iVar4 = xmlStrEqual(local_f8,"invalid");
              if (iVar4 != 0) {
                nb_schematas = nb_schematas + 1;
                uVar14 = xmlSchemaNewParserCtxt(pcVar13);
                xmlSchemaSetParserErrors(uVar14,testErrorHandler,testErrorHandler,uVar14);
                lVar7 = xmlSchemaParse(uVar14);
                xmlSchemaFreeParserCtxt(uVar14);
                if (lVar7 == 0) {
                  pcVar15 = strstr(testErrors,"nimplemented");
                  if (pcVar15 != (char *)0x0) {
                    nb_unimplemented = nb_unimplemented + 1;
                    test_log("invalid schemas %s hit an unimplemented block\n",pcVar13);
                    nb_errors = nb_errors + 1;
                  }
                }
                else {
                  test_log("Failed to detect error in schemas %s\n",pcVar13);
                  nb_errors = nb_errors + 1;
                }
                goto LAB_00103679;
              }
              uVar14 = xmlGetLineNo(pxVar6);
              test_log("testGroup line %ld misses unexpected validity value%s\n",uVar14,local_f8);
              goto LAB_00103676;
            }
            nb_schematas = nb_schematas + 1;
            uVar14 = xmlSchemaNewParserCtxt(pcVar13);
            xmlSchemaSetParserErrors(uVar14,testErrorHandler,testErrorHandler,uVar14);
            lVar7 = xmlSchemaParse(uVar14);
            xmlSchemaFreeParserCtxt(uVar14);
            if (lVar7 == 0) {
              test_log("valid schemas %s failed to parse\n",pcVar13);
LAB_00103157:
              nb_errors = nb_errors + 1;
            }
            else {
              pcVar15 = strstr(testErrors,"nimplemented");
              if (pcVar15 != (char *)0x0) {
                test_log("valid schemas %s hit an unimplemented block\n",pcVar13);
                nb_unimplemented = nb_unimplemented + 1;
                goto LAB_00103157;
              }
            }
            for (cur = getNext(pxVar6,"./ts:instanceTest[1]"); cur != (xmlNodePtr)0x0;
                cur = getNext(cur,"following-sibling::ts:instanceTest[1]")) {
              piVar9 = &nb_errors;
              if (lVar7 == 0) {
LAB_001033bd:
                *piVar9 = *piVar9 + 1;
              }
              else {
                xmlResetLastError();
                testErrorsSize = 0;
                testErrors[0] = '\0';
                iVar4 = xmlMemUsed();
                pxVar10 = getString(cur,"string(ts:instanceDocument/@xlink:href)");
                if ((pxVar10 == (xmlChar *)0x0) || (*pxVar10 == '\0')) {
                  uVar14 = xmlGetLineNo(cur);
                  test_log("testGroup line %ld misses href for schemaDocument\n",uVar14);
LAB_001032eb:
                  pcVar15 = (char *)0x0;
LAB_0010330b:
                  local_108 = (xmlChar *)0x0;
LAB_00103313:
                  lVar11 = 0;
                  lVar8 = 0;
                }
                else {
                  pcVar15 = (char *)xmlBuildURI(pxVar10,base);
                  __stream = _stderr;
                  if (pcVar15 == (char *)0x0) {
                    uVar14 = xmlGetLineNo(cur);
                    fprintf(__stream,"Failed to build path to schemas testGroup line %ld : %s\n",
                            uVar14,pxVar10);
                    goto LAB_001032eb;
                  }
                  iVar2 = stat64(pcVar15,&local_c0);
                  if ((iVar2 == -1) || ((local_c0.st_mode & 0xf000) != 0x8000)) {
                    uVar14 = xmlGetLineNo(cur);
                    test_log("schemas for testGroup line %ld is missing: %s\n",uVar14,pcVar15);
                    goto LAB_0010330b;
                  }
                  local_108 = getString(cur,"string(ts:expected/@validity)");
                  if (local_108 == (xmlChar *)0x0) {
                    xstcMetadata_cold_2();
                    goto LAB_0010330b;
                  }
                  nb_tests = nb_tests + 1;
                  lVar8 = xmlReadFile(pcVar15,0,2);
                  if (lVar8 == 0) {
                    xstcMetadata_cold_1();
                    goto LAB_00103313;
                  }
                  lVar11 = xmlSchemaNewValidCtxt(lVar7);
                  xmlSchemaSetValidErrors(lVar11,testErrorHandler,testErrorHandler,lVar11);
                  iVar2 = xmlSchemaValidateDoc(lVar11,lVar8);
                  iVar3 = xmlStrEqual(local_108,"valid");
                  if (iVar3 == 0) {
                    iVar3 = xmlStrEqual(local_108,"invalid");
                    if (iVar3 == 0) {
                      uVar14 = xmlGetLineNo(cur);
                      test_log("instanceDocument line %ld has unexpected validity value%s\n",uVar14,
                               local_108);
                    }
                    else if (iVar2 == 0) {
                      msg = "Failed to detect invalid instance %s against %s\n";
                      goto LAB_001032bb;
                    }
                  }
                  else {
                    if (iVar2 < 1) {
                      if (-1 < iVar2) goto LAB_00103319;
                      test_log("valid instance %s got internal error validating %s\n",pcVar15,
                               pcVar13);
                      nb_internals = nb_internals + 1;
                    }
                    else {
                      msg = "valid instance %s failed to validate against %s\n";
LAB_001032bb:
                      test_log(msg,pcVar15,pcVar13);
                    }
                    nb_errors = nb_errors + 1;
                  }
                }
LAB_00103319:
                if (pxVar10 != (xmlChar *)0x0) {
                  (*_xmlFree)(pxVar10);
                }
                if (pcVar15 != (char *)0x0) {
                  (*_xmlFree)(pcVar15);
                }
                if (local_108 != (xmlChar *)0x0) {
                  (*_xmlFree)();
                }
                if (lVar11 != 0) {
                  xmlSchemaFreeValidCtxt(lVar11);
                }
                if (lVar8 != 0) {
                  xmlFreeDoc(lVar8);
                }
                xmlResetLastError();
                iVar2 = xmlMemUsed();
                if (iVar4 != iVar2) {
                  uVar14 = xmlGetLineNo(cur);
                  iVar2 = xmlMemUsed();
                  test_log("Validation of tests starting line %ld leaked %d\n",uVar14,
                           (ulong)(uint)(iVar2 - iVar4));
                  piVar9 = &nb_leaks;
                  goto LAB_001033bd;
                }
              }
            }
          }
LAB_00103679:
          if (pxVar12 != (xmlChar *)0x0) {
            (*_xmlFree)(pxVar12);
          }
          if (pcVar13 != (char *)0x0) {
            (*_xmlFree)(pcVar13);
          }
          if (local_f8 != (xmlChar *)0x0) {
            (*_xmlFree)();
          }
          if (lVar7 != 0) {
            xmlSchemaFree(lVar7);
          }
          xmlResetLastError();
          iVar4 = xmlMemUsed();
          if (iVar1 != iVar4) {
            uVar14 = xmlGetLineNo(pxVar6);
            iVar4 = xmlMemUsed();
            test_log("Processing test line %ld %s leaked %d\n",uVar14,pcVar13,
                     (ulong)(uint)(iVar4 - iVar1));
            nb_leaks = nb_leaks + 1;
          }
          pxVar6 = getNext(pxVar6,"following-sibling::ts:testGroup[1]");
        } while (pxVar6 != (xmlNodePtr)0x0);
      }
      iVar1 = xmlFreeDoc(lVar5);
      return iVar1;
    }
    pcVar13 = "Unexpected format %s\n";
  }
  iVar1 = fprintf(_stderr,pcVar13,metadata);
  return iVar1;
}

Assistant:

static int
xstcMetadata(const char *metadata, const char *base) {
    xmlDocPtr doc;
    xmlNodePtr cur;
    xmlChar *contributor;
    xmlChar *name;
    int ret = 0;

    doc = xmlReadFile(metadata, NULL, XML_PARSE_NOENT);
    if (doc == NULL) {
        fprintf(stderr, "Failed to parse %s\n", metadata);
	return(-1);
    }

    cur = xmlDocGetRootElement(doc);
    if ((cur == NULL) || (!xmlStrEqual(cur->name, BAD_CAST "testSet"))) {
        fprintf(stderr, "Unexpected format %s\n", metadata);
	return(-1);
    }
    contributor = xmlGetProp(cur, BAD_CAST "contributor");
    if (contributor == NULL) {
        contributor = xmlStrdup(BAD_CAST "Unknown");
    }
    name = xmlGetProp(cur, BAD_CAST "name");
    if (name == NULL) {
        name = xmlStrdup(BAD_CAST "Unknown");
    }
    printf("## %s test suite for Schemas version %s\n", contributor, name);
    xmlFree(contributor);
    xmlFree(name);

    cur = getNext(cur, "./ts:testGroup[1]");
    if ((cur == NULL) || (!xmlStrEqual(cur->name, BAD_CAST "testGroup"))) {
        fprintf(stderr, "Unexpected format %s\n", metadata);
	ret = -1;
	goto done;
    }
    while (cur != NULL) {
        xstcTestGroup(cur, base);
	cur = getNext(cur, "following-sibling::ts:testGroup[1]");
    }

done:
    xmlFreeDoc(doc);
    return(ret);
}